

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blas1_s.cpp
# Opt level: O0

int isamax(int n,float *dx,int incx)

{
  double dVar1;
  int local_2c;
  int local_28;
  int value;
  int ix;
  int i;
  float dmax;
  int incx_local;
  float *dx_local;
  int n_local;
  
  if ((n < 1) || (incx < 1)) {
    dx_local._4_4_ = 0;
  }
  else {
    local_2c = 1;
    if (n == 1) {
      dx_local._4_4_ = 1;
    }
    else {
      if (incx == 1) {
        dVar1 = std::fabs((double)(ulong)(uint)*dx);
        ix = SUB84(dVar1,0);
        for (value = 1; value < n; value = value + 1) {
          dVar1 = std::fabs((double)(ulong)(uint)dx[value]);
          if ((float)ix < SUB84(dVar1,0)) {
            local_2c = value + 1;
            dVar1 = std::fabs((double)(ulong)(uint)dx[value]);
            ix = SUB84(dVar1,0);
          }
        }
      }
      else {
        dVar1 = std::fabs((double)(ulong)(uint)*dx);
        ix = SUB84(dVar1,0);
        local_28 = incx;
        for (value = 1; value < n; value = value + 1) {
          dVar1 = std::fabs((double)(ulong)(uint)dx[local_28]);
          if ((float)ix < SUB84(dVar1,0)) {
            local_2c = value + 1;
            dVar1 = std::fabs((double)(ulong)(uint)dx[local_28]);
            ix = SUB84(dVar1,0);
          }
          local_28 = local_28 + incx;
        }
      }
      dx_local._4_4_ = local_2c;
    }
  }
  return dx_local._4_4_;
}

Assistant:

int isamax ( int n, float dx[], int incx )

//****************************************************************************80
//
//  Purpose:
//
//    ISAMAX finds the index of the float vector element of maximum absolute value.
//
//  Discussion:
//
//    WARNING: This index is a 1-based index, not a 0-based index!
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    23 February 2006
//
//  Author:
//
//    C++ version by John Burkardt
//
//  Reference:
//
//    Jack Dongarra, Cleve Moler, Jim Bunch, Pete Stewart,
//    LINPACK User's Guide,
//    SIAM, 1979,
//    ISBN13: 978-0-898711-72-1,
//    LC: QA214.L56.
//
//    Charles Lawson, Richard Hanson, David Kincaid, Fred Krogh,
//    Basic Linear Algebra Subprograms for Fortran Usage,
//    Algorithm 539,
//    ACM Transactions on Mathematical Software,
//    Volume 5, Number 3, September 1979, pages 308-323.
//
//  Parameters:
//
//    Input, int N, the number of entries in the vector.
//
//    Input, float X[*], the vector to be examined.
//
//    Input, int INCX, the increment between successive entries of SX.
//
//    Output, int ISAMAX, the index of the element of maximum
//    absolute value.
//
{
  float dmax;
  int i;
  int ix;
  int value;

  value = 0;

  if ( n < 1 || incx <= 0 )
  {
    return value;
  }

  value = 1;

  if ( n == 1 )
  {
    return value;
  }

  if ( incx == 1 )
  {
    dmax = fabs ( dx[0] );

    for ( i = 1; i < n; i++ )
    {
      if ( dmax < fabs ( dx[i] ) )
      {
        value = i + 1;
        dmax = fabs ( dx[i] );
      }
    }
  }
  else
  {
    ix = 0;
    dmax = fabs ( dx[0] );
    ix = ix + incx;

    for ( i = 1; i < n; i++ )
    {
      if ( dmax < fabs ( dx[ix] ) )
      {
        value = i + 1;
        dmax = fabs ( dx[ix] );
      }
      ix = ix + incx;
    }
  }

  return value;
}